

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int normal_scanAtts(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  ATTRIBUTE *pAVar8;
  char **ppcVar9;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *pcVar10;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  byte *pbVar11;
  byte *pbVar12;
  byte *pbVar13;
  byte *local_48;
  byte *local_40;
  char *local_38;
  uint uVar7;
  
  uVar4 = (long)end - (long)ptr;
  if ((long)uVar4 < 1) {
    return -1;
  }
  local_38 = end + -2;
  pcVar10 = end;
  local_48 = (byte *)ptr;
LAB_006d70da:
  pbVar12 = local_48;
  uVar7 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*local_48);
  uVar6 = uVar7 - 5;
  if (0x16 < uVar6) goto switchD_006d70fb_caseD_8;
  pAVar8 = (ATTRIBUTE *)
           ((long)&switchD_006d70fb::switchdataD_00901d24 +
           (long)(int)(&switchD_006d70fb::switchdataD_00901d24)[uVar6]);
  switch(uVar7) {
  case 5:
    if (uVar4 == 1) {
      return -2;
    }
    iVar3 = (*enc[3].nameLength)(enc,(char *)local_48);
    if ((iVar3 == 0) &&
       (iVar3 = (*enc[3].scanners[0])(enc,(char *)pbVar12,extraout_RDX_03,&pAVar8->name), iVar3 != 0
       )) {
      local_48 = pbVar12 + 2;
      pcVar10 = extraout_RDX_04;
      goto LAB_006d7105;
    }
    break;
  case 6:
    if (uVar4 < 3) {
      return -2;
    }
    pcVar10 = (*enc[3].skipS)(enc,(char *)local_48);
    if (((int)pcVar10 == 0) &&
       (iVar3 = (*enc[3].scanners[1])(enc,(char *)pbVar12,extraout_RDX_01,&pAVar8->name), iVar3 != 0
       )) {
      local_48 = pbVar12 + 3;
      pcVar10 = extraout_RDX_02;
      goto LAB_006d7105;
    }
    break;
  case 7:
    if (uVar4 < 4) {
      return -2;
    }
    iVar3 = (*enc[3].getAtts)(enc,(char *)local_48,(int)pcVar10,pAVar8);
    if ((iVar3 == 0) &&
       (iVar3 = (*enc[3].scanners[2])(enc,(char *)pbVar12,extraout_RDX,&pAVar8->name), iVar3 != 0))
    {
      local_48 = pbVar12 + 4;
      pcVar10 = extraout_RDX_00;
      goto LAB_006d7105;
    }
    break;
  case 9:
  case 10:
  case 0x15:
    pbVar12 = local_48 + 1;
    lVar5 = (long)end - (long)pbVar12;
    while( true ) {
      if (lVar5 < 1) {
        return -1;
      }
      bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar12);
      if ((1 < bVar1 - 9) && (bVar1 != 0x15)) break;
      pbVar12 = pbVar12 + 1;
      lVar5 = lVar5 + -1;
    }
    if (bVar1 == 0xe) goto switchD_006d70fb_caseD_e;
    break;
  case 0xe:
switchD_006d70fb_caseD_e:
    pbVar13 = pbVar12 + 1;
    if ((byte *)end == pbVar13 || (long)end - (long)pbVar13 < 0) {
      return -1;
    }
    bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar13);
    uVar6 = (uint)bVar1;
    if ((bVar1 & 0xfe) != 0xc) {
      lVar5 = (long)local_38 - (long)pbVar12;
      do {
        pbVar12 = pbVar13;
        pbVar13 = pbVar12;
        if ((0x15 < (byte)uVar6) || ((0x200600U >> (uVar6 & 0x1f) & 1) == 0))
        goto switchD_006d7212_caseD_0;
        if (lVar5 < 1) {
          return -1;
        }
        bVar1 = *(byte *)((long)enc[1].scanners + (ulong)pbVar12[1]);
        uVar6 = (uint)bVar1;
        lVar5 = lVar5 + -1;
        pbVar13 = pbVar12 + 1;
      } while ((bVar1 & 0xfe) != 0xc);
    }
LAB_006d71cc:
    local_48 = pbVar12 + 2;
    do {
      while( true ) {
        pbVar12 = local_48;
        uVar4 = (long)end - (long)local_48;
        if ((long)uVar4 < 1) {
          return -1;
        }
        bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*local_48);
        if (bVar1 == (byte)uVar6) {
          pbVar13 = local_48 + 1;
          if ((byte *)end == pbVar13 || (long)end - (long)pbVar13 < 0) {
            return -1;
          }
          bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar13);
          uVar6 = (uint)bVar1;
          if (bVar1 < 0xb) {
            if (1 < uVar6 - 9) goto switchD_006d7212_caseD_0;
          }
          else if (bVar1 != 0x15) {
            if (uVar6 == 0xb) goto LAB_006d7592;
            pbVar12 = pbVar13;
            if (uVar6 == 0x11) goto LAB_006d7561;
            goto switchD_006d70fb_caseD_8;
          }
          pbVar11 = local_48 + 2;
          if ((byte *)end == pbVar11 || (long)end - (long)pbVar11 < 0) {
            return -1;
          }
          pcVar10 = (char *)0x2;
          lVar5 = 0;
          goto LAB_006d73d4;
        }
        uVar7 = (uint)bVar1;
        if (uVar7 < 9) break;
switchD_006d7212_caseD_4:
        local_48 = local_48 + 1;
      }
      pbVar13 = pbVar12;
      switch(uVar7) {
      default:
        goto switchD_006d7212_caseD_0;
      case 3:
        iVar3 = normal_scanRef(enc,(char *)(local_48 + 1),end,(char **)&local_48);
        if (iVar3 < 1) {
          pbVar12 = local_48;
          if (iVar3 != 0) {
            return iVar3;
          }
          goto switchD_006d70fb_caseD_8;
        }
        break;
      case 4:
        goto switchD_006d7212_caseD_4;
      case 5:
        goto switchD_006d7212_caseD_5;
      case 6:
        if (uVar4 < 3) {
          return -2;
        }
        pcVar10 = (*enc[3].skipS)(enc,(char *)local_48);
        if ((int)pcVar10 != 0) goto switchD_006d7212_caseD_0;
        local_48 = pbVar12 + 3;
        break;
      case 7:
        if (uVar4 < 4) {
          return -2;
        }
        iVar3 = (*enc[3].getAtts)(enc,(char *)local_48,0x901d80,
                                  (ATTRIBUTE *)
                                  ((long)&switchD_006d7212::switchdataD_00901d80 +
                                  (long)(int)(&switchD_006d7212::switchdataD_00901d80)[uVar7]));
        if (iVar3 != 0) goto switchD_006d7212_caseD_0;
        local_48 = pbVar12 + 4;
      }
    } while( true );
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
    local_48 = local_48 + 1;
    goto LAB_006d7105;
  }
  goto switchD_006d70fb_caseD_8;
LAB_006d73d4:
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)local_48[(long)pcVar10])) {
  case 5:
    goto switchD_006d73fc_caseD_5;
  case 6:
    ppcVar9 = (char **)(end + (lVar5 - (long)local_48) + -2);
    if (ppcVar9 < (char **)0x3) {
      return -2;
    }
    local_40 = local_48 + (2 - lVar5);
    local_48 = pbVar13;
    pcVar10 = (*enc[3].skipS)(enc,(char *)local_40);
    pbVar13 = pbVar11;
    if (((int)pcVar10 != 0) ||
       (iVar3 = (*enc[3].literalScanners[1])(enc,(char *)local_40,extraout_RDX_09,ppcVar9),
       iVar3 == 0)) goto switchD_006d7212_caseD_0;
    local_48 = pbVar12 + (5 - lVar5);
    pcVar10 = extraout_RDX_10;
    goto LAB_006d7105;
  case 7:
    pAVar8 = (ATTRIBUTE *)(end + (lVar5 - (long)local_48) + -2);
    if (pAVar8 < (ATTRIBUTE *)0x4) {
      return -2;
    }
    local_40 = local_48 + (2 - lVar5);
    local_48 = pbVar13;
    iVar3 = (*enc[3].getAtts)(enc,(char *)local_40,(int)pcVar10,pAVar8);
    pbVar13 = local_40;
    if ((iVar3 != 0) ||
       (iVar3 = (*enc[3].nameMatchesAscii)(enc,(char *)local_40,extraout_RDX_05,(char *)pAVar8),
       pbVar13 = pbVar11, iVar3 == 0)) goto switchD_006d7212_caseD_0;
    local_48 = pbVar12 + (6 - lVar5);
    pcVar10 = extraout_RDX_06;
    goto LAB_006d7105;
  default:
    pbVar13 = local_48 + (2 - lVar5);
    goto switchD_006d7212_caseD_0;
  case 9:
  case 10:
  case 0x15:
    goto switchD_006d73fc_caseD_9;
  case 0xb:
    pbVar13 = local_48 + (2 - lVar5);
LAB_006d7592:
    pbVar12 = pbVar13 + 1;
    iVar3 = 1;
    break;
  case 0x11:
    pbVar13 = local_48 + (2 - lVar5);
LAB_006d7561:
    pbVar12 = pbVar13 + 1;
    if ((byte *)end == pbVar12 || (long)end - (long)pbVar12 < 0) {
      return -1;
    }
    if (pbVar13[1] == 0x3e) {
      pbVar12 = pbVar13 + 2;
    }
    iVar3 = (uint)(pbVar13[1] == 0x3e) * 3;
    break;
  case 0x16:
  case 0x18:
    local_48 = local_48 + (3 - lVar5);
    goto LAB_006d7105;
  }
  goto LAB_006d753c;
switchD_006d73fc_caseD_9:
  pbVar11 = pbVar11 + 1;
  lVar2 = lVar5 - (long)local_48;
  lVar5 = lVar5 + -1;
  pcVar10 = pcVar10 + 1;
  if (end + lVar2 == (char *)0x3 || (long)(end + lVar2 + -3) < 0) {
    return -1;
  }
  goto LAB_006d73d4;
switchD_006d7212_caseD_5:
  if (uVar4 == 1) {
    return -2;
  }
  iVar3 = (*enc[3].nameLength)(enc,(char *)local_48);
  if (iVar3 != 0) goto switchD_006d7212_caseD_0;
  goto LAB_006d71cc;
switchD_006d73fc_caseD_5:
  ppcVar9 = (char **)(end + (lVar5 - (long)local_48));
  if (ppcVar9 == (char **)0x3) {
    return -2;
  }
  local_40 = local_48 + (2 - lVar5);
  local_48 = pbVar13;
  iVar3 = (*enc[3].nameLength)(enc,(char *)local_40);
  pbVar13 = pbVar11;
  if ((iVar3 == 0) &&
     (iVar3 = (*enc[3].literalScanners[0])(enc,(char *)local_40,extraout_RDX_07,ppcVar9), iVar3 != 0
     )) {
    local_48 = pbVar12 + (4 - lVar5);
    pcVar10 = extraout_RDX_08;
LAB_006d7105:
    uVar4 = (long)end - (long)local_48;
    if ((long)uVar4 < 1) {
      return -1;
    }
    goto LAB_006d70da;
  }
switchD_006d7212_caseD_0:
  pbVar12 = pbVar13;
switchD_006d70fb_caseD_8:
  iVar3 = 0;
LAB_006d753c:
  *nextTokPtr = (char *)pbVar12;
  return iVar3;
}

Assistant:

static int PTRCALL
PREFIX(scanAtts)(const ENCODING *enc, const char *ptr, const char *end,
                 const char **nextTokPtr) {
#  ifdef XML_NS
  int hadColon = 0;
#  endif
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
#  ifdef XML_NS
    case BT_COLON:
      if (hadColon) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      hadColon = 1;
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      switch (BYTE_TYPE(enc, ptr)) {
        CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      break;
#  endif
    case BT_S:
    case BT_CR:
    case BT_LF:
      for (;;) {
        int t;

        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        t = BYTE_TYPE(enc, ptr);
        if (t == BT_EQUALS)
          break;
        switch (t) {
        case BT_S:
        case BT_LF:
        case BT_CR:
          break;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
      }
      /* fall through */
    case BT_EQUALS: {
      int open;
#  ifdef XML_NS
      hadColon = 0;
#  endif
      for (;;) {
        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        open = BYTE_TYPE(enc, ptr);
        if (open == BT_QUOT || open == BT_APOS)
          break;
        switch (open) {
        case BT_S:
        case BT_LF:
        case BT_CR:
          break;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
      }
      ptr += MINBPC(enc);
      /* in attribute value */
      for (;;) {
        int t;
        REQUIRE_CHAR(enc, ptr, end);
        t = BYTE_TYPE(enc, ptr);
        if (t == open)
          break;
        switch (t) {
          INVALID_CASES(ptr, nextTokPtr)
        case BT_AMP: {
          int tok = PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, &ptr);
          if (tok <= 0) {
            if (tok == XML_TOK_INVALID)
              *nextTokPtr = ptr;
            return tok;
          }
          break;
        }
        case BT_LT:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        default:
          ptr += MINBPC(enc);
          break;
        }
      }
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S:
      case BT_CR:
      case BT_LF:
        break;
      case BT_SOL:
        goto sol;
      case BT_GT:
        goto gt;
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      /* ptr points to closing quote */
      for (;;) {
        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        switch (BYTE_TYPE(enc, ptr)) {
          CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
        case BT_S:
        case BT_CR:
        case BT_LF:
          continue;
        case BT_GT:
        gt:
          *nextTokPtr = ptr + MINBPC(enc);
          return XML_TOK_START_TAG_WITH_ATTS;
        case BT_SOL:
        sol:
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          if (! CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          *nextTokPtr = ptr + MINBPC(enc);
          return XML_TOK_EMPTY_ELEMENT_WITH_ATTS;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
        break;
      }
      break;
    }
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}